

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O3

void vkt::synchronization::anon_unknown_0::ShaderAccess::initPassthroughPrograms
               (SourceCollections *programCollection,string *shaderPrefix,string *declCode,
               string *mainCode,VkShaderStageFlagBits stage)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  char *pcVar3;
  size_t sVar4;
  ostream *poVar5;
  ProgramSources *pPVar6;
  VkShaderStageFlagBits VVar7;
  VkShaderStageFlagBits VVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ostringstream src;
  undefined1 auStack_238 [8];
  string local_230;
  size_type *local_210;
  value_type local_208;
  long *local_1e8;
  long local_1e0;
  long local_1d8 [2];
  string *local_1c8;
  string *local_1c0;
  SourceCollections *local_1b8;
  string *local_1b0;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  VVar8 = stage;
  if ((stage & VK_SHADER_STAGE_COMPUTE_BIT) == 0) {
    VVar7 = VK_SHADER_STAGE_FRAGMENT_BIT|VK_SHADER_STAGE_VERTEX_BIT;
    if ((stage & VK_SHADER_STAGE_ALL_GRAPHICS) == 0) {
      VVar7 = 0;
    }
    VVar8 = VVar7 | (VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT|
                    VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT);
    if ((stage & (VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT|
                 VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT)) == 0) {
      VVar8 = VVar7;
    }
    VVar8 = stage & VK_SHADER_STAGE_GEOMETRY_BIT | VVar8;
  }
  local_1c8 = mainCode;
  local_1c0 = declCode;
  local_1b8 = programCollection;
  local_1b0 = shaderPrefix;
  if ((VVar8 & VK_SHADER_STAGE_VERTEX_BIT) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    pcVar3 = glu::getGLSLVersionDeclaration(GLSL_VERSION_440);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)auStack_238 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x90);
    }
    else {
      sVar4 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout(location = 0) in vec4 v_in_position;\n",0x2c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"out ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"gl_PerVertex {\n    vec4 gl_Position;\n}",0x26);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";\n",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    if ((stage & VK_SHADER_STAGE_VERTEX_BIT) == 0) {
      local_210 = &local_208._M_string_length;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"");
    }
    else {
      local_210 = &local_208._M_string_length;
      pcVar2 = (local_1c0->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_210,pcVar2,pcVar2 + local_1c0->_M_string_length);
      std::__cxx11::string::append((char *)&local_210);
    }
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)local_210,(long)local_208._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"void main (void)\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"{\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"    gl_Position = v_in_position;\n",0x21);
    paVar1 = &local_230.field_2;
    local_230._M_dataplus._M_p = (pointer)paVar1;
    if ((stage & VK_SHADER_STAGE_VERTEX_BIT) == 0) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"");
    }
    else {
      pcVar2 = (local_1c8->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_230,pcVar2,pcVar2 + local_1c8->_M_string_length);
    }
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_230._M_dataplus._M_p,local_230._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != paVar1) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    if (local_210 != &local_208._M_string_length) {
      operator_delete(local_210,local_208._M_string_length + 1);
    }
    pcVar2 = (local_1b0->_M_dataplus)._M_p;
    local_230._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_230,pcVar2,pcVar2 + local_1b0->_M_string_length);
    std::__cxx11::string::append((char *)&local_230);
    pPVar6 = ::vk::ProgramCollection<glu::ProgramSources>::add(&local_1b8->glslSources,&local_230);
    std::__cxx11::stringbuf::str();
    local_210 = (size_type *)((ulong)local_210 & 0xffffffff00000000);
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_208,local_1e8,local_1e0 + (long)local_1e8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pPVar6->sources + ((ulong)local_210 & 0xffffffff),&local_208);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if (local_1e8 != local_1d8) {
      operator_delete(local_1e8,local_1d8[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != paVar1) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  if ((VVar8 & VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    pcVar3 = glu::getGLSLVersionDeclaration(GLSL_VERSION_440);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)auStack_238 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x90);
    }
    else {
      sVar4 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout(vertices = 3) out;\n",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"in ",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"gl_PerVertex {\n    vec4 gl_Position;\n}",0x26);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8," gl_in[gl_MaxPatchVertices];\n",0x1d);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"out ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"gl_PerVertex {\n    vec4 gl_Position;\n}",0x26);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," gl_out[];\n",0xb);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    if ((stage & VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT) == 0) {
      local_210 = &local_208._M_string_length;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"");
    }
    else {
      local_210 = &local_208._M_string_length;
      pcVar2 = (local_1c0->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_210,pcVar2,pcVar2 + local_1c0->_M_string_length);
      std::__cxx11::string::append((char *)&local_210);
    }
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)local_210,(long)local_208._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"void main (void)\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"{\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"    gl_TessLevelInner[0] = 1.0;\n",0x20);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"    gl_TessLevelInner[1] = 1.0;\n",0x20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"    gl_TessLevelOuter[0] = 1.0;\n",0x20);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"    gl_TessLevelOuter[1] = 1.0;\n",0x20);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"    gl_TessLevelOuter[2] = 1.0;\n",0x20);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"    gl_TessLevelOuter[3] = 1.0;\n",0x20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,
               "    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n",
               0x4e);
    if ((stage & VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT) == 0) {
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"");
    }
    else {
      std::operator+(&local_230,"\n",local_1c8);
    }
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_230._M_dataplus._M_p,local_230._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}\n",2);
    paVar1 = &local_230.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != paVar1) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    if (local_210 != &local_208._M_string_length) {
      operator_delete(local_210,local_208._M_string_length + 1);
    }
    pcVar2 = (local_1b0->_M_dataplus)._M_p;
    local_230._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_230,pcVar2,pcVar2 + local_1b0->_M_string_length);
    std::__cxx11::string::append((char *)&local_230);
    pPVar6 = ::vk::ProgramCollection<glu::ProgramSources>::add(&local_1b8->glslSources,&local_230);
    std::__cxx11::stringbuf::str();
    local_210 = (size_type *)CONCAT44(local_210._4_4_,3);
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_208,local_1e8,local_1e0 + (long)local_1e8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pPVar6->sources + ((ulong)local_210 & 0xffffffff),&local_208);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if (local_1e8 != local_1d8) {
      operator_delete(local_1e8,local_1d8[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != paVar1) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  if ((VVar8 & VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    pcVar3 = glu::getGLSLVersionDeclaration(GLSL_VERSION_440);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)auStack_238 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x90);
    }
    else {
      sVar4 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout(triangles, equal_spacing, ccw) in;\n",0x2a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"in ",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"gl_PerVertex {\n    vec4 gl_Position;\n}",0x26);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8," gl_in[gl_MaxPatchVertices];\n",0x1d);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"out ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"gl_PerVertex {\n    vec4 gl_Position;\n}",0x26);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";\n",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    if ((stage & VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT) == 0) {
      local_210 = &local_208._M_string_length;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"");
    }
    else {
      local_210 = &local_208._M_string_length;
      pcVar2 = (local_1c0->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_210,pcVar2,pcVar2 + local_1c0->_M_string_length);
      std::__cxx11::string::append((char *)&local_210);
    }
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)local_210,(long)local_208._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"void main (void)\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"{\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"    vec3 px = gl_TessCoord.x * gl_in[0].gl_Position.xyz;\n",0x39);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"    vec3 py = gl_TessCoord.y * gl_in[1].gl_Position.xyz;\n",0x39);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"    vec3 pz = gl_TessCoord.z * gl_in[2].gl_Position.xyz;\n",0x39);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"    gl_Position = vec4(px + py + pz, 1.0);\n",0x2b);
    paVar1 = &local_230.field_2;
    local_230._M_dataplus._M_p = (pointer)paVar1;
    if ((stage & VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT) == 0) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"");
    }
    else {
      pcVar2 = (local_1c8->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_230,pcVar2,pcVar2 + local_1c8->_M_string_length);
    }
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_230._M_dataplus._M_p,local_230._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != paVar1) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    if (local_210 != &local_208._M_string_length) {
      operator_delete(local_210,local_208._M_string_length + 1);
    }
    pcVar2 = (local_1b0->_M_dataplus)._M_p;
    local_230._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_230,pcVar2,pcVar2 + local_1b0->_M_string_length);
    std::__cxx11::string::append((char *)&local_230);
    pPVar6 = ::vk::ProgramCollection<glu::ProgramSources>::add(&local_1b8->glslSources,&local_230);
    std::__cxx11::stringbuf::str();
    local_210 = (size_type *)CONCAT44(local_210._4_4_,4);
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_208,local_1e8,local_1e0 + (long)local_1e8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pPVar6->sources + ((ulong)local_210 & 0xffffffff),&local_208);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if (local_1e8 != local_1d8) {
      operator_delete(local_1e8,local_1d8[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != paVar1) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  if ((VVar8 & VK_SHADER_STAGE_GEOMETRY_BIT) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    pcVar3 = glu::getGLSLVersionDeclaration(GLSL_VERSION_440);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)auStack_238 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x90);
    }
    else {
      sVar4 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout(triangles) in;\n",0x16);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout(triangle_strip, max_vertices = 3) out;\n",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"in ",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"gl_PerVertex {\n    vec4 gl_Position;\n}",0x26);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," gl_in[];\n",10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"out ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"gl_PerVertex {\n    vec4 gl_Position;\n}",0x26);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";\n",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    if ((stage & VK_SHADER_STAGE_GEOMETRY_BIT) == 0) {
      local_210 = &local_208._M_string_length;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"");
    }
    else {
      local_210 = &local_208._M_string_length;
      pcVar2 = (local_1c0->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_210,pcVar2,pcVar2 + local_1c0->_M_string_length);
      std::__cxx11::string::append((char *)&local_210);
    }
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)local_210,(long)local_208._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"void main (void)\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"{\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"    gl_Position = gl_in[0].gl_Position;\n",0x28);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"    EmitVertex();\n",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"    gl_Position = gl_in[1].gl_Position;\n",0x28);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"    EmitVertex();\n",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"    gl_Position = gl_in[2].gl_Position;\n",0x28);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"    EmitVertex();\n",0x12);
    if ((stage & VK_SHADER_STAGE_GEOMETRY_BIT) == 0) {
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"");
    }
    else {
      std::operator+(&local_230,"\n",local_1c8);
    }
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_230._M_dataplus._M_p,local_230._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}\n",2);
    paVar1 = &local_230.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != paVar1) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    if (local_210 != &local_208._M_string_length) {
      operator_delete(local_210,local_208._M_string_length + 1);
    }
    pcVar2 = (local_1b0->_M_dataplus)._M_p;
    local_230._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_230,pcVar2,pcVar2 + local_1b0->_M_string_length);
    std::__cxx11::string::append((char *)&local_230);
    pPVar6 = ::vk::ProgramCollection<glu::ProgramSources>::add(&local_1b8->glslSources,&local_230);
    std::__cxx11::stringbuf::str();
    local_210 = (size_type *)CONCAT44(local_210._4_4_,2);
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_208,local_1e8,local_1e0 + (long)local_1e8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pPVar6->sources + ((ulong)local_210 & 0xffffffff),&local_208);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if (local_1e8 != local_1d8) {
      operator_delete(local_1e8,local_1d8[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != paVar1) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  if ((VVar8 & VK_SHADER_STAGE_FRAGMENT_BIT) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    pcVar3 = glu::getGLSLVersionDeclaration(GLSL_VERSION_440);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)auStack_238 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x90);
    }
    else {
      sVar4 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout(location = 0) out vec4 o_color;\n",0x27);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    if ((stage & VK_SHADER_STAGE_FRAGMENT_BIT) == 0) {
      local_210 = &local_208._M_string_length;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"");
    }
    else {
      local_210 = &local_208._M_string_length;
      pcVar2 = (local_1c0->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_210,pcVar2,pcVar2 + local_1c0->_M_string_length);
      std::__cxx11::string::append((char *)&local_210);
    }
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)local_210,(long)local_208._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"void main (void)\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"{\n",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"    o_color = vec4(1.0);\n",0x19);
    if ((stage & VK_SHADER_STAGE_FRAGMENT_BIT) == 0) {
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"");
    }
    else {
      std::operator+(&local_230,"\n",local_1c8);
    }
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_230._M_dataplus._M_p,local_230._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}\n",2);
    paVar1 = &local_230.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != paVar1) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    if (local_210 != &local_208._M_string_length) {
      operator_delete(local_210,local_208._M_string_length + 1);
    }
    pcVar2 = (local_1b0->_M_dataplus)._M_p;
    local_230._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_230,pcVar2,pcVar2 + local_1b0->_M_string_length);
    std::__cxx11::string::append((char *)&local_230);
    pPVar6 = ::vk::ProgramCollection<glu::ProgramSources>::add(&local_1b8->glslSources,&local_230);
    std::__cxx11::stringbuf::str();
    local_210 = (size_type *)CONCAT44(local_210._4_4_,1);
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_208,local_1e8,local_1e0 + (long)local_1e8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pPVar6->sources + ((ulong)local_210 & 0xffffffff),&local_208);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if (local_1e8 != local_1d8) {
      operator_delete(local_1e8,local_1d8[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != paVar1) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  if ((VVar8 & VK_SHADER_STAGE_COMPUTE_BIT) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    pcVar3 = glu::getGLSLVersionDeclaration(GLSL_VERSION_440);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)auStack_238 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x90);
    }
    else {
      sVar4 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout(local_size_x = 1) in;\n",0x1d);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    if ((stage & VK_SHADER_STAGE_COMPUTE_BIT) == 0) {
      local_210 = &local_208._M_string_length;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"");
    }
    else {
      local_210 = &local_208._M_string_length;
      pcVar2 = (local_1c0->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_210,pcVar2,pcVar2 + local_1c0->_M_string_length);
      std::__cxx11::string::append((char *)&local_210);
    }
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)local_210,(long)local_208._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"void main (void)\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"{\n",2);
    paVar1 = &local_230.field_2;
    local_230._M_dataplus._M_p = (pointer)paVar1;
    if ((stage & VK_SHADER_STAGE_COMPUTE_BIT) == 0) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"");
    }
    else {
      pcVar2 = (local_1c8->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_230,pcVar2,pcVar2 + local_1c8->_M_string_length);
    }
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_230._M_dataplus._M_p,local_230._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != paVar1) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    if (local_210 != &local_208._M_string_length) {
      operator_delete(local_210,local_208._M_string_length + 1);
    }
    pcVar2 = (local_1b0->_M_dataplus)._M_p;
    local_230._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_230,pcVar2,pcVar2 + local_1b0->_M_string_length);
    std::__cxx11::string::append((char *)&local_230);
    pPVar6 = ::vk::ProgramCollection<glu::ProgramSources>::add(&local_1b8->glslSources,&local_230);
    std::__cxx11::stringbuf::str();
    local_210 = (size_type *)CONCAT44(local_210._4_4_,5);
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_208,local_1e8,local_1e0 + (long)local_1e8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pPVar6->sources + ((ulong)local_210 & 0xffffffff),&local_208);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if (local_1e8 != local_1d8) {
      operator_delete(local_1e8,local_1d8[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != paVar1) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  return;
}

Assistant:

void initPassthroughPrograms (SourceCollections&			programCollection,
							  const std::string&			shaderPrefix,
							  const std::string&			declCode,
							  const std::string&			mainCode,
							  const VkShaderStageFlagBits	stage)
{
	const VkShaderStageFlags	requiredStages	= getRequiredStages(stage);

	if (requiredStages & VK_SHADER_STAGE_VERTEX_BIT)
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_440) << "\n"
			<< "\n"
			<< "layout(location = 0) in vec4 v_in_position;\n"
			<< "\n"
			<< "out " << s_perVertexBlock << ";\n"
			<< "\n"
			<< (stage & VK_SHADER_STAGE_VERTEX_BIT ? declCode + "\n" : "")
			<< "void main (void)\n"
			<< "{\n"
			<< "    gl_Position = v_in_position;\n"
			<< (stage & VK_SHADER_STAGE_VERTEX_BIT ? mainCode : "")
			<< "}\n";

		programCollection.glslSources.add(shaderPrefix + "vert") << glu::VertexSource(src.str());
	}

	if (requiredStages & VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT)
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_440) << "\n"
			<< "\n"
			<< "layout(vertices = 3) out;\n"
			<< "\n"
			<< "in " << s_perVertexBlock << " gl_in[gl_MaxPatchVertices];\n"
			<< "\n"
			<< "out " << s_perVertexBlock << " gl_out[];\n"
			<< "\n"
			<< (stage & VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT ? declCode + "\n" : "")
			<< "void main (void)\n"
			<< "{\n"
			<< "    gl_TessLevelInner[0] = 1.0;\n"
			<< "    gl_TessLevelInner[1] = 1.0;\n"
			<< "\n"
			<< "    gl_TessLevelOuter[0] = 1.0;\n"
			<< "    gl_TessLevelOuter[1] = 1.0;\n"
			<< "    gl_TessLevelOuter[2] = 1.0;\n"
			<< "    gl_TessLevelOuter[3] = 1.0;\n"
			<< "\n"
			<< "    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
			<< (stage & VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT ? "\n" + mainCode : "")
			<< "}\n";

		programCollection.glslSources.add(shaderPrefix + "tesc") << glu::TessellationControlSource(src.str());
	}

	if (requiredStages & VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT)
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_440) << "\n"
			<< "\n"
			<< "layout(triangles, equal_spacing, ccw) in;\n"
			<< "\n"
			<< "in " << s_perVertexBlock << " gl_in[gl_MaxPatchVertices];\n"
			<< "\n"
			<< "out " << s_perVertexBlock << ";\n"
			<< "\n"
			<< (stage & VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT ? declCode + "\n" : "")
			<< "void main (void)\n"
			<< "{\n"
			<< "    vec3 px = gl_TessCoord.x * gl_in[0].gl_Position.xyz;\n"
			<< "    vec3 py = gl_TessCoord.y * gl_in[1].gl_Position.xyz;\n"
			<< "    vec3 pz = gl_TessCoord.z * gl_in[2].gl_Position.xyz;\n"
			<< "    gl_Position = vec4(px + py + pz, 1.0);\n"
			<< (stage & VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT ? mainCode : "")
			<< "}\n";

		programCollection.glslSources.add(shaderPrefix + "tese") << glu::TessellationEvaluationSource(src.str());
	}

	if (requiredStages & VK_SHADER_STAGE_GEOMETRY_BIT)
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_440) << "\n"
			<< "\n"
			<< "layout(triangles) in;\n"
			<< "layout(triangle_strip, max_vertices = 3) out;\n"
			<< "\n"
			<< "in " << s_perVertexBlock << " gl_in[];\n"
			<< "\n"
			<< "out " << s_perVertexBlock << ";\n"
			<< "\n"
			<< (stage & VK_SHADER_STAGE_GEOMETRY_BIT ? declCode + "\n" : "")
			<< "void main (void)\n"
			<< "{\n"
			<< "    gl_Position = gl_in[0].gl_Position;\n"
			<< "    EmitVertex();\n"
			<< "\n"
			<< "    gl_Position = gl_in[1].gl_Position;\n"
			<< "    EmitVertex();\n"
			<< "\n"
			<< "    gl_Position = gl_in[2].gl_Position;\n"
			<< "    EmitVertex();\n"
			<< (stage & VK_SHADER_STAGE_GEOMETRY_BIT ? "\n" + mainCode : "")
			<< "}\n";

		programCollection.glslSources.add(shaderPrefix + "geom") << glu::GeometrySource(src.str());
	}

	if (requiredStages & VK_SHADER_STAGE_FRAGMENT_BIT)
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_440) << "\n"
			<< "\n"
			<< "layout(location = 0) out vec4 o_color;\n"
			<< "\n"
			<< (stage & VK_SHADER_STAGE_FRAGMENT_BIT ? declCode + "\n" : "")
			<< "void main (void)\n"
			<< "{\n"
			<< "    o_color = vec4(1.0);\n"
			<< (stage & VK_SHADER_STAGE_FRAGMENT_BIT ? "\n" + mainCode : "")
			<< "}\n";

		programCollection.glslSources.add(shaderPrefix + "frag") << glu::FragmentSource(src.str());
	}

	if (requiredStages & VK_SHADER_STAGE_COMPUTE_BIT)
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_440) << "\n"
			<< "\n"
			<< "layout(local_size_x = 1) in;\n"
			<< "\n"
			<< (stage & VK_SHADER_STAGE_COMPUTE_BIT ? declCode + "\n" : "")
			<< "void main (void)\n"
			<< "{\n"
			<< (stage & VK_SHADER_STAGE_COMPUTE_BIT ? mainCode : "")
			<< "}\n";

		programCollection.glslSources.add(shaderPrefix + "comp") << glu::ComputeSource(src.str());
	}
}